

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O2

string * __thiscall
iDynTree::Visualizer::getModelInstanceName_abi_cxx11_
          (string *__return_storage_ptr__,Visualizer *this,size_t modelInstanceIndex)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Visualizer::getModelInstanceName(size_t modelInstanceIndex)
{
    if( modelInstanceIndex >= getNrOfVisualizedModels() )
    {
        return "";
    }

#ifdef IDYNTREE_USES_IRRLICHT
    return pimpl->m_modelViz->at(modelInstanceIndex)->getInstanceName();
#else
    return "";
#endif

}